

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O3

void fld_export(uint8_t *dst,limb_t *src)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  fld_t tmp;
  limb_t local_38 [6];
  
  fld_reduce(local_38,src);
  lVar1 = 0;
  iVar4 = 0;
  uVar5 = 0;
  do {
    uVar5 = local_38[lVar1] << ((byte)iVar4 & 0x3f) | uVar5;
    if (iVar4 < -0x2b) {
      iVar4 = iVar4 + 0x33;
    }
    else {
      uVar3 = iVar4 + 0x3b;
      do {
        uVar2 = uVar3;
        *dst = (uint8_t)uVar5;
        dst = dst + 1;
        uVar5 = uVar5 >> 8;
        uVar3 = uVar2 - 8;
      } while (0xf < uVar3);
      iVar4 = uVar2 - 0x10;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  *dst = (uint8_t)uVar5;
  return;
}

Assistant:

void
fld_export(uint8_t dst[32], const fld_t src)
{
	int i;
	fld_t tmp;
	uint64_t foo = 0;
	int fill = 0;
	
	fld_reduce(tmp, src);

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += FLD_LIMB_BITS; fill >= 8; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
	*dst++ = foo & 0xff;
}